

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::ignorableWhitespace
          (AbstractDOMParser *this,XMLCh *chars,XMLSize_t length,bool param_3)

{
  int iVar1;
  DOMNode *pDVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  DOMException *this_00;
  undefined4 extraout_var;
  
  if ((this->fWithinElement != true) || (this->fIncludeIgnorableWhitespace != true)) {
    return;
  }
  iVar1 = (*this->fCurrentNode->_vptr_DOMNode[4])();
  if (iVar1 == 3) {
    DOMTextImpl::appendDataFast((DOMTextImpl *)this->fCurrentNode,chars,length);
    return;
  }
  iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x23])(this,chars,length);
  pDVar2 = (DOMNode *)CONCAT44(extraout_var,iVar1);
  (*pDVar2->_vptr_DOMNode[0x3a])(pDVar2,1);
  if (((this->fCurrentParent != (DOMNode *)0x0) &&
      (plVar3 = (long *)__dynamic_cast(this->fCurrentParent,&DOMNode::typeinfo,
                                       &HasDOMParentImpl::typeinfo,0xfffffffffffffffe),
      plVar3 != (long *)0x0)) && (lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3), lVar4 != 0)) {
    puVar5 = (undefined8 *)(**(code **)(*plVar3 + 0x10))(plVar3);
    (**(code **)*puVar5)(puVar5,pDVar2);
    this->fCurrentNode = pDVar2;
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void AbstractDOMParser::ignorableWhitespace(  const XMLCh* const    chars
                                            , const XMLSize_t       length
                                            , const bool)
{
    // Ignore chars before the root element
    if (!fWithinElement || !fIncludeIgnorableWhitespace)
        return;

    if (fCurrentNode->getNodeType() == DOMNode::TEXT_NODE)
    {
        DOMTextImpl *node = (DOMTextImpl *)fCurrentNode;
        node->appendDataFast(chars, length);
    }
    else
    {
        DOMTextImpl *node = (DOMTextImpl*)createText (chars, length);
        node->setIgnorableWhitespace(true);
        castToParentImpl (fCurrentParent)->appendChildFast (node);
        fCurrentNode = node;
    }
}